

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O2

void __thiscall juzzlin::Argengine::Impl::printHelp(Impl *this)

{
  element_type *peVar1;
  pointer ppVar2;
  ostream *poVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *optionText;
  pointer psVar6;
  pointer ppVar7;
  OptionDefinitionVector sortedOptionDefinitions;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  helpTexts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> variantsString;
  allocator<char> local_119;
  _Manager_type local_118;
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  local_110;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  pointer local_e0;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  if ((this->m_helpText)._M_string_length != 0) {
    poVar3 = std::operator<<(this->m_out,(string *)&this->m_helpText);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<(this->m_out,"Options:");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  ::vector(&local_110,&this->m_optionDefinitions);
  if (this->m_helpSorting == Ascending) {
    std::
    __sort<__gnu_cxx::__normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>*,std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>>>>,__gnu_cxx::__ops::_Iter_comp_iter<juzzlin::Argengine::Impl::printHelp()const::_lambda(std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>const&,std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>const&)_1_>>
              (local_110.
               super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_110.
               super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0 = local_110.
             super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  for (psVar6 = local_110.
                super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = local_f8.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, psVar6 != local_e0; psVar6 = psVar6 + 1)
  {
    OptionDefinition::getVariantsString_abi_cxx11_
              (&local_70.first,
               (psVar6->
               super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr);
    peVar1 = (psVar6->
             super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    local_118 = (peVar1->singleStringCallback).super__Function_base._M_manager;
    local_d8 = psVar6;
    if (local_118 == (_Manager_type)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_119);
    }
    else {
      std::operator+(&local_b0," [",&peVar1->valueName);
      std::operator+(&local_90,&local_b0,"]");
    }
    std::operator+(&local_d0,&local_70.first,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (local_118 != (_Manager_type)0x0) {
      std::__cxx11::string::~string((string *)&local_b0);
    }
    std::__cxx11::string::~string((string *)&local_70);
    psVar6 = local_d8;
    if (uVar4 < local_d0._M_string_length) {
      uVar4 = local_d0._M_string_length;
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_70,&local_d0,
               &((local_d8->
                 super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->infoText);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&local_f8,&local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  for (ppVar7 = local_f8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2; ppVar7 = ppVar7 + 1) {
    std::operator<<(this->m_out,(string *)ppVar7);
    for (uVar5 = 0; uVar5 < (uVar4 + 2) - (ppVar7->first)._M_string_length; uVar5 = uVar5 + 1) {
      std::operator<<(this->m_out," ");
    }
    std::operator<<(this->m_out,(string *)&ppVar7->second);
    std::endl<char,std::char_traits<char>>(this->m_out);
  }
  std::endl<char,std::char_traits<char>>(this->m_out);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_f8);
  std::
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  ::~vector(&local_110);
  return;
}

Assistant:

void printHelp() const
    {
        if (!m_helpText.empty()) {
            *m_out << m_helpText << std::endl
                   << std::endl;
        }

        *m_out << "Options:" << std::endl
               << std::endl;

        auto sortedOptionDefinitions = m_optionDefinitions;
        if (m_helpSorting == HelpSorting::Ascending) {
            std::sort(sortedOptionDefinitions.begin(), sortedOptionDefinitions.end(), [](const OptionDefinitionSP & l, const OptionDefinitionSP & r) {
                return l->getVariantsString() < r->getVariantsString();
            });
        }

        using ArgumentAndHelpText = std::pair<std::string, std::string>;
        std::vector<ArgumentAndHelpText> helpTexts;
        size_t maxLength = 0;
        for (auto && option : sortedOptionDefinitions) {
            const auto variantsString = option->getVariantsString() + (option->singleStringCallback ? " [" + option->valueName + "]" : "");
            maxLength = std::max(variantsString.size(), maxLength);
            helpTexts.push_back({ variantsString, option->infoText });
        }
        const size_t margin = 2;
        for (auto && optionText : helpTexts) {
            *m_out << optionText.first;
            for (size_t i = 0; i < maxLength + margin - optionText.first.size(); i++) {
                *m_out << " ";
            }
            *m_out << optionText.second;
            *m_out << std::endl;
        }
        *m_out << std::endl;
    }